

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EverCrypt_Hash.c
# Opt level: O0

EverCrypt_Hash_Incremental_state_t *
EverCrypt_Hash_Incremental_malloc(Spec_Hash_Definitions_hash_alg a)

{
  uint32_t uVar1;
  uint8_t *puVar2;
  EverCrypt_Hash_state_s *ctx;
  EverCrypt_Hash_Incremental_state_t *pEVar3;
  EverCrypt_Hash_Incremental_state_t *p;
  EverCrypt_Hash_Incremental_state_t s;
  EverCrypt_Hash_state_s *block_state;
  uint8_t *buf;
  Spec_Hash_Definitions_hash_alg a_local;
  
  block_len(a);
  uVar1 = block_len(a);
  puVar2 = (uint8_t *)calloc((ulong)uVar1,1);
  ctx = create_in(a);
  pEVar3 = (EverCrypt_Hash_Incremental_state_t *)malloc(0x18);
  pEVar3->block_state = ctx;
  pEVar3->buf = puVar2;
  pEVar3->total_len = 0;
  init((EVP_PKEY_CTX *)ctx);
  return pEVar3;
}

Assistant:

EverCrypt_Hash_Incremental_state_t
*EverCrypt_Hash_Incremental_malloc(Spec_Hash_Definitions_hash_alg a)
{
  KRML_CHECK_SIZE(sizeof (uint8_t), block_len(a));
  uint8_t *buf = (uint8_t *)KRML_HOST_CALLOC(block_len(a), sizeof (uint8_t));
  EverCrypt_Hash_state_s *block_state = create_in(a);
  EverCrypt_Hash_Incremental_state_t
  s = { .block_state = block_state, .buf = buf, .total_len = (uint64_t)0U };
  EverCrypt_Hash_Incremental_state_t
  *p =
    (EverCrypt_Hash_Incremental_state_t *)KRML_HOST_MALLOC(sizeof (
        EverCrypt_Hash_Incremental_state_t
      ));
  p[0U] = s;
  init(block_state);
  return p;
}